

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_false,_true>::enumerate_prefix
          (DaTrie<true,_false,_true> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  Bc BVar3;
  pointer pcVar4;
  uint uVar5;
  uint node_pos_00;
  __string_type __str;
  KvPair local_58;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar2 >> 3) <= (ulong)node_pos) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x131,
                  "void ddd::DaTrie<true, false, true>::enumerate_prefix(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  BVar3 = pBVar2[node_pos];
  if (-1 < (long)BVar3) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x132,
                  "void ddd::DaTrie<true, false, true>::enumerate_prefix(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = true]"
                 );
  }
  node_pos_00 = BVar3._0_4_;
  if ((int)node_pos_00 < 0) {
    uVar5 = node_pos_00 & 0x7fffffff;
    if ((node_pos != 0) &&
       (((uint)*(undefined8 *)(&pBVar2->field_0x0 + ((ulong)BVar3 >> 0x1d & 0x3fffffff8)) &
        0x7fffffff) == node_pos)) {
      uVar5 = node_pos_00;
    }
    paVar1 = &local_58.key.field_2;
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_58.key._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar4,pcVar4 + prefix->_M_string_length);
    local_58.value = uVar5;
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::emplace_back<ddd::KvPair>(kvs,&local_58)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.key._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.key._M_dataplus._M_p);
    }
  }
  else {
    if ((*(uint *)&pBVar2[node_pos_00 & 0x7fffffff].field_0x4 & 0x7fffffff) == node_pos) {
      enumerate_prefix(this,node_pos_00,prefix,kvs);
    }
    uVar5 = 1;
    do {
      if ((*(uint *)&(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5 ^ node_pos_00].field_0x4 & 0x7fffffff)
          == node_pos) {
        local_58.key._M_dataplus._M_p = (pointer)&local_58.key.field_2;
        pcVar4 = (prefix->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar4,pcVar4 + prefix->_M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&local_58,local_58.key._M_string_length,0,'\x01');
        enumerate_prefix(this,uVar5 ^ node_pos_00,&local_58.key,kvs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.key._M_dataplus._M_p != &local_58.key.field_2) {
          operator_delete(local_58.key._M_dataplus._M_p);
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x100);
  }
  return;
}

Assistant:

void enumerate_prefix(uint32_t node_pos, const std::string& prefix,
                        std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(Prefix);

    if (bc_[node_pos].is_leaf()) {
      auto value = bc_[node_pos].value();
      if (is_terminal_(node_pos)) {
        value |= (1U << 31);
      }
      kvs.push_back(KvPair{prefix, value});
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate_prefix(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate_prefix(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }